

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O2

void __thiscall
btJacobianEntry::btJacobianEntry
          (btJacobianEntry *this,btMatrix3x3 *world2A,btMatrix3x3 *world2B,btVector3 *rel_pos1,
          btVector3 *rel_pos2,btVector3 *jointAxis,btVector3 *inertiaInvA,btScalar massInvA,
          btVector3 *inertiaInvB,btScalar massInvB)

{
  undefined8 uVar1;
  btScalar bVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 local_50;
  btVector3 local_40;
  
  uVar1 = *(undefined8 *)(jointAxis->m_floats + 2);
  *(undefined8 *)(this->m_linearJointAxis).m_floats = *(undefined8 *)jointAxis->m_floats;
  *(undefined8 *)((this->m_linearJointAxis).m_floats + 2) = uVar1;
  local_50 = btVector3::cross(rel_pos1,&this->m_linearJointAxis);
  bVar4 = operator*(world2A,&local_50);
  *&(this->m_aJ).m_floats = bVar4.m_floats;
  local_40 = operator-(&this->m_linearJointAxis);
  local_50 = btVector3::cross(rel_pos2,&local_40);
  bVar4 = operator*(world2B,&local_50);
  *&(this->m_bJ).m_floats = bVar4.m_floats;
  bVar4 = operator*(inertiaInvA,&this->m_aJ);
  *&(this->m_0MinvJt).m_floats = bVar4.m_floats;
  bVar4 = operator*(inertiaInvB,&this->m_bJ);
  *&(this->m_1MinvJt).m_floats = bVar4.m_floats;
  bVar2 = btVector3::dot(&this->m_0MinvJt,&this->m_aJ);
  bVar3 = btVector3::dot(&this->m_1MinvJt,&this->m_bJ);
  this->m_Adiag = bVar3 + bVar2 + massInvA + massInvB;
  return;
}

Assistant:

btJacobianEntry(
		const btMatrix3x3& world2A,
		const btMatrix3x3& world2B,
		const btVector3& rel_pos1,const btVector3& rel_pos2,
		const btVector3& jointAxis,
		const btVector3& inertiaInvA, 
		const btScalar massInvA,
		const btVector3& inertiaInvB,
		const btScalar massInvB)
		:m_linearJointAxis(jointAxis)
	{
		m_aJ = world2A*(rel_pos1.cross(m_linearJointAxis));
		m_bJ = world2B*(rel_pos2.cross(-m_linearJointAxis));
		m_0MinvJt	= inertiaInvA * m_aJ;
		m_1MinvJt = inertiaInvB * m_bJ;
		m_Adiag = massInvA + m_0MinvJt.dot(m_aJ) + massInvB + m_1MinvJt.dot(m_bJ);

		btAssert(m_Adiag > btScalar(0.0));
	}